

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

bool check_interaction_settings_collision(options_i *options,string *file_options)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  allocator local_a4;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string(local_80,"q",&local_a1);
  iVar1 = (*options->_vptr_options_i[1])(options,local_80);
  if ((char)iVar1 == '\0') {
    std::__cxx11::string::string(local_a0,"quadratic",&local_a2);
    iVar1 = (*options->_vptr_options_i[1])(options,local_a0);
    if ((char)iVar1 == '\0') {
      std::__cxx11::string::string(local_60,"cubic",&local_a3);
      iVar1 = (*options->_vptr_options_i[1])(options,local_60);
      if ((char)iVar1 == '\0') {
        std::__cxx11::string::string(local_40,"interactions",&local_a4);
        iVar1 = (*options->_vptr_options_i[1])(options,local_40);
        std::__cxx11::string::~string(local_40);
        std::__cxx11::string::~string(local_60);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::~string(local_80);
        if ((char)iVar1 == '\0') {
          return false;
        }
        goto LAB_001251a0;
      }
      std::__cxx11::string::~string(local_60);
    }
    std::__cxx11::string::~string(local_a0);
  }
  std::__cxx11::string::~string(local_80);
LAB_001251a0:
  lVar2 = std::__cxx11::string::find((char *)file_options,0x2326ab);
  bVar3 = true;
  if ((lVar2 == -1) &&
     (lVar2 = std::__cxx11::string::find((char *)file_options,0x2326b7), lVar2 == -1)) {
    lVar2 = std::__cxx11::string::find((char *)file_options,0x2326bf);
    bVar3 = lVar2 != -1;
  }
  return bVar3;
}

Assistant:

bool check_interaction_settings_collision(options_i& options, std::string file_options)
{
  bool command_line_has_interaction = options.was_supplied("q") || options.was_supplied("quadratic") ||
      options.was_supplied("cubic") || options.was_supplied("interactions");

  if (!command_line_has_interaction)
    return false;

  // we don't use -q to save pairs in all.file_options, so only 3 options checked
  bool file_options_has_interaction = file_options.find("--quadratic") != std::string::npos;
  file_options_has_interaction = file_options_has_interaction || (file_options.find("--cubic") != std::string::npos);
  file_options_has_interaction =
      file_options_has_interaction || (file_options.find("--interactions") != std::string::npos);

  return file_options_has_interaction;
}